

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

string * el::base::utils::Str::replaceAll(string *str,string *replaceWhat,string *replaceWith)

{
  __type_conflict _Var1;
  ulong uVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_t foundAt;
  string *psVar4;
  string *local_8;
  
  _Var1 = std::operator==(in_RDI,in_RSI);
  local_8 = in_RDI;
  if (!_Var1) {
    while (uVar2 = std::__cxx11::string::find((string *)in_RDI,(ulong)in_RSI), local_8 = in_RDI,
          uVar2 != 0xffffffffffffffff) {
      psVar4 = in_RDI;
      psVar3 = (string *)std::__cxx11::string::length();
      std::__cxx11::string::replace((ulong)in_RDI,uVar2,psVar3);
      in_RDI = psVar4;
    }
  }
  return local_8;
}

Assistant:

static inline std::string& replaceAll(std::string& str, const std::string& replaceWhat,
                                        const std::string& replaceWith) {
    if (replaceWhat == replaceWith)
      return str;
    std::size_t foundAt = std::string::npos;
    while ((foundAt = str.find(replaceWhat, foundAt + 1)) != std::string::npos) {
      str.replace(foundAt, replaceWhat.length(), replaceWith);
    }
    return str;
  }